

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.c
# Opt level: O1

int yaml_emitter_emit_node
              (yaml_emitter_t *emitter,yaml_event_t *event,int root,int sequence,int mapping,
              int simple_key)

{
  yaml_break_t yVar1;
  size_t sVar2;
  yaml_event_t *pyVar3;
  byte *pbVar4;
  int *piVar5;
  bool bVar6;
  yaml_string_t string;
  yaml_string_t string_00;
  bool bVar7;
  char cVar8;
  bool bVar9;
  yaml_char_t yVar10;
  byte bVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  yaml_emitter_state_t *pyVar17;
  char *pcVar18;
  ulong uVar19;
  yaml_char_t *pyVar20;
  yaml_scalar_style_t yVar21;
  byte *pbVar22;
  yaml_char_t *pyVar23;
  long lVar24;
  yaml_scalar_style_t yVar25;
  uint uVar26;
  uint uVar27;
  byte *pbVar28;
  bool bVar29;
  
  emitter->root_context = root;
  emitter->sequence_context = sequence;
  emitter->mapping_context = mapping;
  emitter->simple_key_context = simple_key;
  switch(event->type) {
  case YAML_ALIAS_EVENT:
    iVar12 = yaml_emitter_process_anchor(emitter);
    if (iVar12 == 0) {
      return 0;
    }
    pyVar17 = (emitter->states).top;
    goto LAB_00107b90;
  case YAML_SCALAR_EVENT:
    if ((emitter->tag_data).handle == (yaml_char_t *)0x0) {
      bVar29 = (emitter->tag_data).suffix == (yaml_char_t *)0x0;
    }
    else {
      bVar29 = false;
    }
    yVar21 = (event->data).scalar.style;
    if (((bVar29) && ((event->data).scalar.plain_implicit == 0)) &&
       ((event->data).scalar.quoted_implicit == 0)) {
      emitter->error = YAML_EMITTER_ERROR;
      pcVar18 = "neither tag nor implicit flags are specified";
      goto LAB_00107c51;
    }
    yVar21 = yVar21 + (yVar21 == YAML_ANY_SCALAR_STYLE);
    if (emitter->canonical != 0) {
      yVar21 = YAML_DOUBLE_QUOTED_SCALAR_STYLE;
    }
    if ((simple_key != 0) && ((emitter->scalar_data).multiline != 0)) {
      yVar21 = YAML_DOUBLE_QUOTED_SCALAR_STYLE;
    }
    if (yVar21 == YAML_PLAIN_SCALAR_STYLE) {
      yVar25 = YAML_PLAIN_SCALAR_STYLE;
      if (emitter->flow_level == 0) {
        iVar12 = (emitter->scalar_data).block_plain_allowed;
      }
      else {
        iVar12 = (emitter->scalar_data).flow_plain_allowed;
      }
      if (iVar12 == 0) {
        yVar25 = YAML_SINGLE_QUOTED_SCALAR_STYLE;
      }
      yVar21 = YAML_SINGLE_QUOTED_SCALAR_STYLE;
      if (emitter->flow_level == 0 && simple_key == 0) {
        yVar21 = yVar25;
      }
      if ((emitter->scalar_data).length != 0) {
        yVar21 = yVar25;
      }
      if ((bVar29) && ((event->data).scalar.plain_implicit == 0)) {
        yVar21 = YAML_SINGLE_QUOTED_SCALAR_STYLE;
      }
    }
    if (yVar21 == YAML_SINGLE_QUOTED_SCALAR_STYLE) {
      yVar21 = ((emitter->scalar_data).single_quoted_allowed == 0) + YAML_SINGLE_QUOTED_SCALAR_STYLE
      ;
    }
    if (((yVar21 & ~YAML_PLAIN_SCALAR_STYLE) == YAML_LITERAL_SCALAR_STYLE) &&
       (((emitter->scalar_data).block_allowed == 0 || (simple_key != 0 || emitter->flow_level != 0))
       )) {
      yVar21 = YAML_DOUBLE_QUOTED_SCALAR_STYLE;
    }
    if (((bVar29) && (yVar21 != YAML_PLAIN_SCALAR_STYLE)) &&
       ((event->data).scalar.quoted_implicit == 0)) {
      (emitter->tag_data).handle = "!";
      (emitter->tag_data).handle_length = 1;
    }
    (emitter->scalar_data).style = yVar21;
    iVar12 = yaml_emitter_process_anchor(emitter);
    if (iVar12 == 0) {
      return 0;
    }
    iVar12 = yaml_emitter_process_tag(emitter);
    if (iVar12 == 0) {
      return 0;
    }
    iVar12 = yaml_emitter_increase_indent(emitter,1,0);
    if (iVar12 == 0) {
      return 0;
    }
    break;
  case YAML_SEQUENCE_START_EVENT:
    iVar12 = yaml_emitter_process_anchor(emitter);
    if (iVar12 == 0) {
      return 0;
    }
    iVar12 = yaml_emitter_process_tag(emitter);
    if (iVar12 != 0) {
      if (((emitter->flow_level == 0) && (emitter->canonical == 0)) &&
         (((event->data).sequence_start.style != YAML_FLOW_SEQUENCE_STYLE &&
          (((pyVar3 = (emitter->events).head, (long)(emitter->events).tail - (long)pyVar3 < 0xd0 ||
            (pyVar3->type != YAML_SEQUENCE_START_EVENT)) ||
           (pyVar3[1].type != YAML_SEQUENCE_END_EVENT)))))) {
        emitter->state = YAML_EMIT_BLOCK_SEQUENCE_FIRST_ITEM_STATE;
        return 1;
      }
      emitter->state = YAML_EMIT_FLOW_SEQUENCE_FIRST_ITEM_STATE;
      return 1;
    }
    return 0;
  default:
    emitter->error = YAML_EMITTER_ERROR;
    pcVar18 = "expected SCALAR, SEQUENCE-START, MAPPING-START, or ALIAS";
LAB_00107c51:
    emitter->problem = pcVar18;
    return 0;
  case YAML_MAPPING_START_EVENT:
    iVar12 = yaml_emitter_process_anchor(emitter);
    if (iVar12 == 0) {
      return 0;
    }
    iVar12 = yaml_emitter_process_tag(emitter);
    if (iVar12 != 0) {
      if ((((emitter->flow_level == 0) && (emitter->canonical == 0)) &&
          ((event->data).sequence_start.style != YAML_FLOW_SEQUENCE_STYLE)) &&
         (((pyVar3 = (emitter->events).head, (long)(emitter->events).tail - (long)pyVar3 < 0xd0 ||
           (pyVar3->type != YAML_MAPPING_START_EVENT)) || (pyVar3[1].type != YAML_MAPPING_END_EVENT)
          ))) {
        emitter->state = YAML_EMIT_BLOCK_MAPPING_FIRST_KEY_STATE;
        return 1;
      }
      emitter->state = YAML_EMIT_FLOW_MAPPING_FIRST_KEY_STATE;
      return 1;
    }
    return 0;
  }
  uVar26 = 0;
  uVar27 = 0;
  uVar15 = uVar26;
  bVar29 = false;
  switch((emitter->scalar_data).style) {
  case YAML_PLAIN_SCALAR_STYLE:
    pbVar28 = (emitter->scalar_data).value;
    sVar2 = (emitter->scalar_data).length;
    iVar12 = emitter->simple_key_context;
    if (emitter->whitespace == 0) {
      if ((emitter->buffer).end <= (emitter->buffer).pointer + 5) {
        iVar16 = yaml_emitter_flush(emitter);
        bVar29 = false;
        uVar15 = uVar27;
        if (iVar16 == 0) break;
      }
      pyVar20 = (emitter->buffer).pointer;
      (emitter->buffer).pointer = pyVar20 + 1;
      *pyVar20 = ' ';
      emitter->column = emitter->column + 1;
    }
    if (sVar2 != 0) {
      pbVar22 = pbVar28 + sVar2;
      bVar7 = false;
      bVar29 = false;
      do {
        bVar11 = *pbVar28;
        if (bVar11 < 0x20) {
          if ((bVar11 != 10) && (bVar11 != 0xd)) goto LAB_00107f21;
LAB_00107ecc:
          if ((!bVar7) && (bVar11 == 10)) {
            if (((emitter->buffer).end <= (emitter->buffer).pointer + 5) &&
               (iVar16 = yaml_emitter_flush(emitter), uVar15 = uVar27, iVar16 == 0))
            goto LAB_001093d6;
            yVar1 = emitter->line_break;
            if (yVar1 == YAML_CR_BREAK) {
              yVar10 = '\r';
LAB_00107fe1:
              pyVar20 = (emitter->buffer).pointer;
              (emitter->buffer).pointer = pyVar20 + 1;
              *pyVar20 = yVar10;
            }
            else {
              if (yVar1 == YAML_CRLN_BREAK) {
                pyVar20 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pyVar20 + 1;
                *pyVar20 = '\r';
LAB_00107fdb:
                yVar10 = '\n';
                goto LAB_00107fe1;
              }
              if (yVar1 == YAML_LN_BREAK) goto LAB_00107fdb;
            }
            emitter->column = 0;
            emitter->line = emitter->line + 1;
          }
          if (((emitter->buffer).end <= (emitter->buffer).pointer + 5) &&
             (iVar16 = yaml_emitter_flush(emitter), uVar15 = uVar27, iVar16 == 0))
          goto LAB_001093d6;
          bVar11 = *pbVar28;
          if (bVar11 == 10) {
            if (((emitter->buffer).pointer + 5 < (emitter->buffer).end) ||
               (iVar16 = yaml_emitter_flush(emitter), iVar16 != 0)) {
              yVar1 = emitter->line_break;
              if (yVar1 == YAML_CR_BREAK) {
                yVar10 = '\r';
LAB_001080de:
                pyVar20 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pyVar20 + 1;
                *pyVar20 = yVar10;
              }
              else {
                if (yVar1 == YAML_CRLN_BREAK) {
                  pyVar20 = (emitter->buffer).pointer;
                  (emitter->buffer).pointer = pyVar20 + 1;
                  *pyVar20 = '\r';
LAB_001080d8:
                  yVar10 = '\n';
                  goto LAB_001080de;
                }
                if (yVar1 == YAML_LN_BREAK) goto LAB_001080d8;
              }
              emitter->column = 0;
              emitter->line = emitter->line + 1;
            }
            pbVar28 = pbVar28 + 1;
          }
          else {
            if ((char)bVar11 < '\0') {
              if ((bVar11 & 0xe0) == 0xc0) {
                pbVar4 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar4 + 1;
                *pbVar4 = bVar11;
                bVar11 = pbVar28[1];
                pbVar28 = pbVar28 + 2;
                goto LAB_00108235;
              }
              if ((bVar11 & 0xf0) == 0xe0) {
                pbVar4 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar4 + 1;
                *pbVar4 = bVar11;
                bVar11 = pbVar28[1];
                pbVar4 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar4 + 1;
                *pbVar4 = bVar11;
                bVar11 = pbVar28[2];
                pbVar28 = pbVar28 + 3;
                goto LAB_00108235;
              }
              if ((bVar11 & 0xf8) == 0xf0) {
                pbVar4 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar4 + 1;
                *pbVar4 = bVar11;
                bVar11 = pbVar28[1];
                pbVar4 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar4 + 1;
                *pbVar4 = bVar11;
                bVar11 = pbVar28[2];
                pbVar4 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar4 + 1;
                *pbVar4 = bVar11;
                bVar11 = pbVar28[3];
                pbVar28 = pbVar28 + 4;
                goto LAB_00108235;
              }
            }
            else {
              pbVar28 = pbVar28 + 1;
LAB_00108235:
              pbVar4 = (emitter->buffer).pointer;
              (emitter->buffer).pointer = pbVar4 + 1;
              *pbVar4 = bVar11;
            }
            emitter->column = 0;
            emitter->line = emitter->line + 1;
          }
          emitter->indention = 1;
          bVar7 = true;
        }
        else {
          if (bVar11 != 0xe2) {
            if (bVar11 == 0xc2) {
              if (pbVar28[1] == 0x85) goto LAB_00107ecc;
            }
            else if (bVar11 == 0x20) {
              if (((bVar29 || iVar12 != 0) || (emitter->column <= emitter->best_width)) ||
                 (pbVar28[1] == 0x20)) {
                if (((emitter->buffer).end <= (emitter->buffer).pointer + 5) &&
                   (iVar16 = yaml_emitter_flush(emitter), uVar15 = uVar27, iVar16 == 0))
                goto LAB_001093d6;
                bVar11 = *pbVar28;
                if ((char)bVar11 < '\0') {
                  if ((bVar11 & 0xe0) == 0xc0) {
                    pbVar4 = (emitter->buffer).pointer;
                    (emitter->buffer).pointer = pbVar4 + 1;
                    *pbVar4 = bVar11;
                    bVar11 = pbVar28[1];
                    pbVar28 = pbVar28 + 2;
                    goto LAB_00108303;
                  }
                  if ((bVar11 & 0xf0) == 0xe0) {
                    pbVar4 = (emitter->buffer).pointer;
                    (emitter->buffer).pointer = pbVar4 + 1;
                    *pbVar4 = bVar11;
                    bVar11 = pbVar28[1];
                    pbVar4 = (emitter->buffer).pointer;
                    (emitter->buffer).pointer = pbVar4 + 1;
                    *pbVar4 = bVar11;
                    bVar11 = pbVar28[2];
                    pbVar28 = pbVar28 + 3;
                    goto LAB_00108303;
                  }
                  if ((bVar11 & 0xf8) == 0xf0) {
                    pbVar4 = (emitter->buffer).pointer;
                    (emitter->buffer).pointer = pbVar4 + 1;
                    *pbVar4 = bVar11;
                    bVar11 = pbVar28[1];
                    pbVar4 = (emitter->buffer).pointer;
                    (emitter->buffer).pointer = pbVar4 + 1;
                    *pbVar4 = bVar11;
                    bVar11 = pbVar28[2];
                    pbVar4 = (emitter->buffer).pointer;
                    (emitter->buffer).pointer = pbVar4 + 1;
                    *pbVar4 = bVar11;
                    bVar11 = pbVar28[3];
                    pbVar28 = pbVar28 + 4;
                    goto LAB_00108303;
                  }
                }
                else {
                  pbVar28 = pbVar28 + 1;
LAB_00108303:
                  pbVar4 = (emitter->buffer).pointer;
                  (emitter->buffer).pointer = pbVar4 + 1;
                  *pbVar4 = bVar11;
                }
                emitter->column = emitter->column + 1;
              }
              else {
                iVar16 = yaml_emitter_write_indent(emitter);
                uVar15 = uVar27;
                if (iVar16 == 0) goto LAB_001093d6;
                bVar11 = *pbVar28;
                lVar24 = 1;
                if ((((char)bVar11 < '\0') && (lVar24 = 2, (bVar11 & 0xe0) != 0xc0)) &&
                   (lVar24 = 3, (bVar11 & 0xf0) != 0xe0)) {
                  lVar24 = (ulong)((bVar11 & 0xf8) == 0xf0) << 2;
                }
                pbVar28 = pbVar28 + lVar24;
              }
              bVar29 = true;
              goto LAB_0010831d;
            }
          }
LAB_00107f21:
          if (((bVar7) &&
              (iVar16 = yaml_emitter_write_indent(emitter), uVar15 = uVar27, iVar16 == 0)) ||
             (((emitter->buffer).end <= (emitter->buffer).pointer + 5 &&
              (iVar16 = yaml_emitter_flush(emitter), uVar15 = uVar27, iVar16 == 0))))
          goto LAB_001093d6;
          bVar11 = *pbVar28;
          if ((char)bVar11 < '\0') {
            if ((bVar11 & 0xe0) == 0xc0) {
              pbVar4 = (emitter->buffer).pointer;
              (emitter->buffer).pointer = pbVar4 + 1;
              *pbVar4 = bVar11;
              bVar11 = pbVar28[1];
              pbVar28 = pbVar28 + 2;
              goto LAB_00108187;
            }
            if ((bVar11 & 0xf0) == 0xe0) {
              pbVar4 = (emitter->buffer).pointer;
              (emitter->buffer).pointer = pbVar4 + 1;
              *pbVar4 = bVar11;
              bVar11 = pbVar28[1];
              pbVar4 = (emitter->buffer).pointer;
              (emitter->buffer).pointer = pbVar4 + 1;
              *pbVar4 = bVar11;
              bVar11 = pbVar28[2];
              pbVar28 = pbVar28 + 3;
              goto LAB_00108187;
            }
            if ((bVar11 & 0xf8) == 0xf0) {
              pbVar4 = (emitter->buffer).pointer;
              (emitter->buffer).pointer = pbVar4 + 1;
              *pbVar4 = bVar11;
              bVar11 = pbVar28[1];
              pbVar4 = (emitter->buffer).pointer;
              (emitter->buffer).pointer = pbVar4 + 1;
              *pbVar4 = bVar11;
              bVar11 = pbVar28[2];
              pbVar4 = (emitter->buffer).pointer;
              (emitter->buffer).pointer = pbVar4 + 1;
              *pbVar4 = bVar11;
              bVar11 = pbVar28[3];
              pbVar28 = pbVar28 + 4;
              goto LAB_00108187;
            }
          }
          else {
            pbVar28 = pbVar28 + 1;
LAB_00108187:
            pbVar4 = (emitter->buffer).pointer;
            (emitter->buffer).pointer = pbVar4 + 1;
            *pbVar4 = bVar11;
          }
          emitter->column = emitter->column + 1;
          emitter->indention = 0;
          bVar29 = false;
          bVar7 = false;
        }
LAB_0010831d:
      } while (pbVar28 != pbVar22);
    }
    emitter->whitespace = 0;
    emitter->indention = 0;
    bVar29 = true;
    uVar15 = uVar27;
    if (emitter->root_context != 0) {
      emitter->open_ended = 1;
    }
    break;
  case YAML_SINGLE_QUOTED_SCALAR_STYLE:
    pbVar28 = (emitter->scalar_data).value;
    sVar2 = (emitter->scalar_data).length;
    iVar12 = emitter->simple_key_context;
    bVar29 = false;
    iVar16 = yaml_emitter_write_indicator(emitter,"\'",1,0,0);
    uVar15 = uVar27;
    if (iVar16 != 0) {
      if (sVar2 != 0) {
        bVar7 = false;
        pbVar22 = pbVar28;
        do {
          bVar11 = *pbVar22;
          if (bVar11 < 0x20) {
            if ((bVar11 != 10) && (bVar11 != 0xd)) goto LAB_00108f0e;
LAB_00108eb9:
            if ((!bVar29) && (bVar11 == 10)) {
              if (((emitter->buffer).end <= (emitter->buffer).pointer + 5) &&
                 (iVar16 = yaml_emitter_flush(emitter), uVar15 = uVar27, iVar16 == 0))
              goto LAB_001093d6;
              yVar1 = emitter->line_break;
              if (yVar1 == YAML_CR_BREAK) {
                yVar10 = '\r';
LAB_00109007:
                pyVar20 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pyVar20 + 1;
                *pyVar20 = yVar10;
              }
              else {
                if (yVar1 == YAML_CRLN_BREAK) {
                  pyVar20 = (emitter->buffer).pointer;
                  (emitter->buffer).pointer = pyVar20 + 1;
                  *pyVar20 = '\r';
LAB_00109001:
                  yVar10 = '\n';
                  goto LAB_00109007;
                }
                if (yVar1 == YAML_LN_BREAK) goto LAB_00109001;
              }
              emitter->column = 0;
              emitter->line = emitter->line + 1;
            }
            if (((emitter->buffer).end <= (emitter->buffer).pointer + 5) &&
               (iVar16 = yaml_emitter_flush(emitter), uVar15 = uVar27, iVar16 == 0))
            goto LAB_001093d6;
            bVar11 = *pbVar22;
            if (bVar11 == 10) {
              if (((emitter->buffer).pointer + 5 < (emitter->buffer).end) ||
                 (iVar16 = yaml_emitter_flush(emitter), iVar16 != 0)) {
                yVar1 = emitter->line_break;
                if (yVar1 == YAML_CR_BREAK) {
                  yVar10 = '\r';
LAB_00109104:
                  pyVar20 = (emitter->buffer).pointer;
                  (emitter->buffer).pointer = pyVar20 + 1;
                  *pyVar20 = yVar10;
                }
                else {
                  if (yVar1 == YAML_CRLN_BREAK) {
                    pyVar20 = (emitter->buffer).pointer;
                    (emitter->buffer).pointer = pyVar20 + 1;
                    *pyVar20 = '\r';
LAB_001090fe:
                    yVar10 = '\n';
                    goto LAB_00109104;
                  }
                  if (yVar1 == YAML_LN_BREAK) goto LAB_001090fe;
                }
                emitter->column = 0;
                emitter->line = emitter->line + 1;
              }
              pbVar22 = pbVar22 + 1;
            }
            else {
              if ((char)bVar11 < '\0') {
                if ((bVar11 & 0xe0) == 0xc0) {
                  pbVar4 = (emitter->buffer).pointer;
                  (emitter->buffer).pointer = pbVar4 + 1;
                  *pbVar4 = bVar11;
                  bVar11 = pbVar22[1];
                  pbVar22 = pbVar22 + 2;
                  goto LAB_0010925b;
                }
                if ((bVar11 & 0xf0) == 0xe0) {
                  pbVar4 = (emitter->buffer).pointer;
                  (emitter->buffer).pointer = pbVar4 + 1;
                  *pbVar4 = bVar11;
                  bVar11 = pbVar22[1];
                  pbVar4 = (emitter->buffer).pointer;
                  (emitter->buffer).pointer = pbVar4 + 1;
                  *pbVar4 = bVar11;
                  bVar11 = pbVar22[2];
                  pbVar22 = pbVar22 + 3;
                  goto LAB_0010925b;
                }
                if ((bVar11 & 0xf8) == 0xf0) {
                  pbVar4 = (emitter->buffer).pointer;
                  (emitter->buffer).pointer = pbVar4 + 1;
                  *pbVar4 = bVar11;
                  bVar11 = pbVar22[1];
                  pbVar4 = (emitter->buffer).pointer;
                  (emitter->buffer).pointer = pbVar4 + 1;
                  *pbVar4 = bVar11;
                  bVar11 = pbVar22[2];
                  pbVar4 = (emitter->buffer).pointer;
                  (emitter->buffer).pointer = pbVar4 + 1;
                  *pbVar4 = bVar11;
                  bVar11 = pbVar22[3];
                  pbVar22 = pbVar22 + 4;
                  goto LAB_0010925b;
                }
              }
              else {
                pbVar22 = pbVar22 + 1;
LAB_0010925b:
                pbVar4 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar4 + 1;
                *pbVar4 = bVar11;
              }
              emitter->column = 0;
              emitter->line = emitter->line + 1;
            }
            emitter->indention = 1;
            bVar29 = true;
          }
          else {
            if (bVar11 != 0xe2) {
              if (bVar11 == 0xc2) {
                if (pbVar22[1] == 0x85) goto LAB_00108eb9;
              }
              else if (bVar11 == 0x20) {
                if (((bVar7 || iVar12 != 0) ||
                    ((pbVar22 == pbVar28 + sVar2 + -1 || pbVar22 == pbVar28) ||
                     emitter->column <= emitter->best_width)) || (pbVar22[1] == 0x20)) {
                  if (((emitter->buffer).end <= (emitter->buffer).pointer + 5) &&
                     (iVar16 = yaml_emitter_flush(emitter), uVar15 = uVar26, iVar16 == 0))
                  goto LAB_001093d6;
                  bVar11 = *pbVar22;
                  if ((char)bVar11 < '\0') {
                    if ((bVar11 & 0xe0) == 0xc0) {
                      pbVar4 = (emitter->buffer).pointer;
                      (emitter->buffer).pointer = pbVar4 + 1;
                      *pbVar4 = bVar11;
                      bVar11 = pbVar22[1];
                      pbVar22 = pbVar22 + 2;
                      goto LAB_00109329;
                    }
                    if ((bVar11 & 0xf0) == 0xe0) {
                      pbVar4 = (emitter->buffer).pointer;
                      (emitter->buffer).pointer = pbVar4 + 1;
                      *pbVar4 = bVar11;
                      bVar11 = pbVar22[1];
                      pbVar4 = (emitter->buffer).pointer;
                      (emitter->buffer).pointer = pbVar4 + 1;
                      *pbVar4 = bVar11;
                      bVar11 = pbVar22[2];
                      pbVar22 = pbVar22 + 3;
                      goto LAB_00109329;
                    }
                    if ((bVar11 & 0xf8) == 0xf0) {
                      pbVar4 = (emitter->buffer).pointer;
                      (emitter->buffer).pointer = pbVar4 + 1;
                      *pbVar4 = bVar11;
                      bVar11 = pbVar22[1];
                      pbVar4 = (emitter->buffer).pointer;
                      (emitter->buffer).pointer = pbVar4 + 1;
                      *pbVar4 = bVar11;
                      bVar11 = pbVar22[2];
                      pbVar4 = (emitter->buffer).pointer;
                      (emitter->buffer).pointer = pbVar4 + 1;
                      *pbVar4 = bVar11;
                      bVar11 = pbVar22[3];
                      pbVar22 = pbVar22 + 4;
                      goto LAB_00109329;
                    }
                  }
                  else {
                    pbVar22 = pbVar22 + 1;
LAB_00109329:
                    pbVar4 = (emitter->buffer).pointer;
                    (emitter->buffer).pointer = pbVar4 + 1;
                    *pbVar4 = bVar11;
                  }
                  emitter->column = emitter->column + 1;
                }
                else {
                  iVar16 = yaml_emitter_write_indent(emitter);
                  uVar15 = uVar26;
                  if (iVar16 == 0) goto LAB_001093d6;
                  bVar11 = *pbVar22;
                  lVar24 = 1;
                  if ((((char)bVar11 < '\0') && (lVar24 = 2, (bVar11 & 0xe0) != 0xc0)) &&
                     (lVar24 = 3, (bVar11 & 0xf0) != 0xe0)) {
                    lVar24 = (ulong)((bVar11 & 0xf8) == 0xf0) << 2;
                  }
                  pbVar22 = pbVar22 + lVar24;
                }
                bVar7 = true;
                goto LAB_00109343;
              }
            }
LAB_00108f0e:
            if ((bVar29) &&
               (iVar16 = yaml_emitter_write_indent(emitter), uVar15 = uVar27, iVar16 == 0))
            goto LAB_001093d6;
            if (*pbVar22 == 0x27) {
              if (((emitter->buffer).end <= (emitter->buffer).pointer + 5) &&
                 (iVar16 = yaml_emitter_flush(emitter), uVar15 = uVar27, iVar16 == 0))
              goto LAB_001093d6;
              pyVar20 = (emitter->buffer).pointer;
              (emitter->buffer).pointer = pyVar20 + 1;
              *pyVar20 = '\'';
              emitter->column = emitter->column + 1;
            }
            if (((emitter->buffer).end <= (emitter->buffer).pointer + 5) &&
               (iVar16 = yaml_emitter_flush(emitter), uVar15 = uVar27, iVar16 == 0))
            goto LAB_001093d6;
            bVar11 = *pbVar22;
            if ((char)bVar11 < '\0') {
              if ((bVar11 & 0xe0) == 0xc0) {
                pbVar4 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar4 + 1;
                *pbVar4 = bVar11;
                bVar11 = pbVar22[1];
                pbVar22 = pbVar22 + 2;
                goto LAB_001091ad;
              }
              if ((bVar11 & 0xf0) == 0xe0) {
                pbVar4 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar4 + 1;
                *pbVar4 = bVar11;
                bVar11 = pbVar22[1];
                pbVar4 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar4 + 1;
                *pbVar4 = bVar11;
                bVar11 = pbVar22[2];
                pbVar22 = pbVar22 + 3;
                goto LAB_001091ad;
              }
              if ((bVar11 & 0xf8) == 0xf0) {
                pbVar4 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar4 + 1;
                *pbVar4 = bVar11;
                bVar11 = pbVar22[1];
                pbVar4 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar4 + 1;
                *pbVar4 = bVar11;
                bVar11 = pbVar22[2];
                pbVar4 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar4 + 1;
                *pbVar4 = bVar11;
                bVar11 = pbVar22[3];
                pbVar22 = pbVar22 + 4;
                goto LAB_001091ad;
              }
            }
            else {
              pbVar22 = pbVar22 + 1;
LAB_001091ad:
              pbVar4 = (emitter->buffer).pointer;
              (emitter->buffer).pointer = pbVar4 + 1;
              *pbVar4 = bVar11;
            }
            emitter->column = emitter->column + 1;
            emitter->indention = 0;
            bVar7 = false;
            bVar29 = false;
          }
LAB_00109343:
        } while (pbVar22 != pbVar28 + sVar2);
        if ((bVar29) && (iVar12 = yaml_emitter_write_indent(emitter), uVar15 = uVar26, iVar12 == 0))
        {
LAB_001093d6:
          bVar29 = false;
          break;
        }
      }
      pcVar18 = "\'";
LAB_001093e5:
      bVar29 = false;
      iVar12 = yaml_emitter_write_indicator(emitter,pcVar18,0,0,0);
      uVar15 = uVar26;
      if (iVar12 != 0) {
        emitter->whitespace = 0;
        emitter->indention = 0;
        bVar29 = true;
      }
    }
    break;
  case YAML_DOUBLE_QUOTED_SCALAR_STYLE:
    pbVar28 = (emitter->scalar_data).value;
    sVar2 = (emitter->scalar_data).length;
    iVar12 = emitter->simple_key_context;
    bVar29 = false;
    iVar16 = yaml_emitter_write_indicator(emitter,"\"",1,0,0);
    uVar15 = uVar27;
    if (iVar16 != 0) {
      if (sVar2 != 0) {
        bVar29 = false;
        pbVar22 = pbVar28;
        do {
          bVar11 = *pbVar22;
          uVar27 = (uint)bVar11;
          if ((byte)(bVar11 - 0x20) < 0x5f || uVar27 == 10) {
LAB_0010849d:
            if (((char)bVar11 < '\0') && (emitter->unicode == 0)) goto LAB_001084af;
            uVar15 = uVar26;
            if (0x5b < uVar27) {
              if (uVar27 < 0xe2) {
                if (uVar27 != 0x5c) {
LAB_00108602:
                  if ((uVar27 != 0xc2) || (pbVar22[1] != 0x85)) goto LAB_00108aa3;
                }
              }
              else {
                if (uVar27 == 0xe2) goto LAB_00108a99;
                if (uVar27 != 0xef) goto LAB_00108aa3;
                if ((pbVar22[1] != 0xbb) || (pbVar22[2] != 0xbf)) goto LAB_00108602;
              }
              goto LAB_001084af;
            }
            if (uVar27 < 0x20) {
              if ((uVar27 == 10) || (uVar27 == 0xd)) goto LAB_001084af;
LAB_00108aa3:
              if (((emitter->buffer).end <= (emitter->buffer).pointer + 5) &&
                 (iVar16 = yaml_emitter_flush(emitter), iVar16 == 0)) goto LAB_001093d6;
              bVar11 = *pbVar22;
              if ((char)bVar11 < '\0') {
                if ((bVar11 & 0xe0) == 0xc0) {
                  pbVar4 = (emitter->buffer).pointer;
                  (emitter->buffer).pointer = pbVar4 + 1;
                  *pbVar4 = bVar11;
                  bVar11 = pbVar22[1];
                  pbVar22 = pbVar22 + 2;
                  goto LAB_00108c78;
                }
                if ((bVar11 & 0xf0) == 0xe0) {
                  pbVar4 = (emitter->buffer).pointer;
                  (emitter->buffer).pointer = pbVar4 + 1;
                  *pbVar4 = bVar11;
                  bVar11 = pbVar22[1];
                  pbVar4 = (emitter->buffer).pointer;
                  (emitter->buffer).pointer = pbVar4 + 1;
                  *pbVar4 = bVar11;
                  bVar11 = pbVar22[2];
                  pbVar22 = pbVar22 + 3;
                  goto LAB_00108c78;
                }
                if ((bVar11 & 0xf8) == 0xf0) {
                  pbVar4 = (emitter->buffer).pointer;
                  (emitter->buffer).pointer = pbVar4 + 1;
                  *pbVar4 = bVar11;
                  bVar11 = pbVar22[1];
                  pbVar4 = (emitter->buffer).pointer;
                  (emitter->buffer).pointer = pbVar4 + 1;
                  *pbVar4 = bVar11;
                  bVar11 = pbVar22[2];
                  pbVar4 = (emitter->buffer).pointer;
                  (emitter->buffer).pointer = pbVar4 + 1;
                  *pbVar4 = bVar11;
                  bVar11 = pbVar22[3];
                  pbVar22 = pbVar22 + 4;
                  goto LAB_00108c78;
                }
              }
              else {
                pbVar22 = pbVar22 + 1;
LAB_00108c78:
                pbVar4 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar4 + 1;
                *pbVar4 = bVar11;
              }
              emitter->column = emitter->column + 1;
              bVar29 = false;
            }
            else {
              if (uVar27 != 0x20) {
LAB_00108a99:
                if (uVar27 != 0x22) goto LAB_00108aa3;
                goto LAB_001084af;
              }
              if ((bVar29 || iVar12 != 0) ||
                 ((pbVar22 == pbVar28 + sVar2 + -1 || pbVar22 == pbVar28) ||
                  emitter->column <= emitter->best_width)) {
                if (((emitter->buffer).end <= (emitter->buffer).pointer + 5) &&
                   (iVar16 = yaml_emitter_flush(emitter), iVar16 == 0)) goto LAB_001093d6;
                bVar11 = *pbVar22;
                if ((char)bVar11 < '\0') {
                  if ((bVar11 & 0xe0) == 0xc0) {
                    pbVar4 = (emitter->buffer).pointer;
                    (emitter->buffer).pointer = pbVar4 + 1;
                    *pbVar4 = bVar11;
                    bVar11 = pbVar22[1];
                    pbVar22 = pbVar22 + 2;
                    goto LAB_00108cd5;
                  }
                  if ((bVar11 & 0xf0) == 0xe0) {
                    pbVar4 = (emitter->buffer).pointer;
                    (emitter->buffer).pointer = pbVar4 + 1;
                    *pbVar4 = bVar11;
                    bVar11 = pbVar22[1];
                    pbVar4 = (emitter->buffer).pointer;
                    (emitter->buffer).pointer = pbVar4 + 1;
                    *pbVar4 = bVar11;
                    bVar11 = pbVar22[2];
                    pbVar22 = pbVar22 + 3;
                    goto LAB_00108cd5;
                  }
                  if ((bVar11 & 0xf8) == 0xf0) {
                    pbVar4 = (emitter->buffer).pointer;
                    (emitter->buffer).pointer = pbVar4 + 1;
                    *pbVar4 = bVar11;
                    bVar11 = pbVar22[1];
                    pbVar4 = (emitter->buffer).pointer;
                    (emitter->buffer).pointer = pbVar4 + 1;
                    *pbVar4 = bVar11;
                    bVar11 = pbVar22[2];
                    pbVar4 = (emitter->buffer).pointer;
                    (emitter->buffer).pointer = pbVar4 + 1;
                    *pbVar4 = bVar11;
                    bVar11 = pbVar22[3];
                    pbVar22 = pbVar22 + 4;
                    goto LAB_00108cd5;
                  }
                }
                else {
                  pbVar22 = pbVar22 + 1;
LAB_00108cd5:
                  pbVar4 = (emitter->buffer).pointer;
                  (emitter->buffer).pointer = pbVar4 + 1;
                  *pbVar4 = bVar11;
                }
                emitter->column = emitter->column + 1;
              }
              else {
                iVar16 = yaml_emitter_write_indent(emitter);
                bVar29 = false;
                if (iVar16 == 0) goto switchD_00107dbe_default;
                if (pbVar22[1] == 0x20) {
                  if (((emitter->buffer).end <= (emitter->buffer).pointer + 5) &&
                     (iVar16 = yaml_emitter_flush(emitter), iVar16 == 0))
                  goto switchD_00107dbe_default;
                  pyVar20 = (emitter->buffer).pointer;
                  (emitter->buffer).pointer = pyVar20 + 1;
                  *pyVar20 = '\\';
                  emitter->column = emitter->column + 1;
                }
                bVar11 = *pbVar22;
                lVar24 = 1;
                if ((((char)bVar11 < '\0') && (lVar24 = 2, (bVar11 & 0xe0) != 0xc0)) &&
                   (lVar24 = 3, (bVar11 & 0xf0) != 0xe0)) {
                  lVar24 = (ulong)((bVar11 & 0xf8) == 0xf0) << 2;
                }
                pbVar22 = pbVar22 + lVar24;
              }
              bVar29 = true;
            }
          }
          else {
            if (uVar27 != 0xc2) {
              if (0x29 < (byte)(bVar11 + 0x3d)) goto LAB_00108566;
              goto LAB_0010849d;
            }
            if (0x9f < pbVar22[1]) goto LAB_0010849d;
LAB_00108566:
            if (uVar27 != 0xef) {
              if ((uVar27 != 0xee) && ((uVar27 != 0xed || (0x9f < pbVar22[1])))) goto LAB_001084af;
              goto LAB_0010849d;
            }
            if (pbVar22[1] == 0xbf) {
              if ((pbVar22[2] & 0xfe) != 0xbe) goto LAB_0010849d;
            }
            else if ((pbVar22[1] != 0xbb) || (pbVar22[2] != 0xbf)) goto LAB_0010849d;
LAB_001084af:
            uVar13 = 1;
            if ((((char)bVar11 < '\0') && (uVar13 = 2, (uVar27 & 0xffffffe0) != 0xc0)) &&
               (uVar13 = 3, (uVar27 & 0xfffffff0) != 0xe0)) {
              uVar13 = (uint)((uVar27 & 0xfffffff8) == 0xf0) << 2;
            }
            if ((char)bVar11 < '\0') {
              if ((uVar27 & 0xffffffe0) == 0xc0) {
                uVar27 = uVar27 & 0x1f;
              }
              else if ((uVar27 & 0xfffffff0) == 0xe0) {
                uVar27 = uVar27 & 0xf;
              }
              else {
                uVar15 = uVar27 & 0xfffffff8;
                uVar27 = uVar27 & 7;
                if (uVar15 != 0xf0) {
                  uVar27 = 0;
                }
              }
            }
            if (1 < uVar13) {
              uVar19 = 1;
              do {
                uVar27 = uVar27 << 6 | pbVar22[uVar19] & 0x3f;
                uVar19 = uVar19 + 1;
              } while (uVar13 != uVar19);
            }
            if (((emitter->buffer).pointer + 5 < (emitter->buffer).end) ||
               (iVar16 = yaml_emitter_flush(emitter), iVar16 != 0)) {
              pyVar20 = (emitter->buffer).pointer;
              (emitter->buffer).pointer = pyVar20 + 1;
              *pyVar20 = '\\';
              emitter->column = emitter->column + 1;
              if ((int)uVar27 < 0x1b) {
                switch(uVar27) {
                case 0:
                  pyVar20 = (emitter->buffer).pointer + 5;
                  yVar10 = '0';
                  break;
                default:
                  goto switchD_00108793_caseD_1;
                case 7:
                  pyVar20 = (emitter->buffer).pointer + 5;
                  yVar10 = 'a';
                  break;
                case 8:
                  pyVar20 = (emitter->buffer).pointer + 5;
                  yVar10 = 'b';
                  break;
                case 9:
                  pyVar20 = (emitter->buffer).pointer + 5;
                  yVar10 = 't';
                  break;
                case 10:
                  pyVar20 = (emitter->buffer).pointer + 5;
                  yVar10 = 'n';
                  break;
                case 0xb:
                  pyVar20 = (emitter->buffer).pointer + 5;
                  yVar10 = 'v';
                  break;
                case 0xc:
                  pyVar20 = (emitter->buffer).pointer + 5;
                  yVar10 = 'f';
                  break;
                case 0xd:
                  pyVar20 = (emitter->buffer).pointer + 5;
                  yVar10 = 'r';
                }
LAB_001088c9:
                if (((emitter->buffer).end <= pyVar20) &&
                   (iVar16 = yaml_emitter_flush(emitter), iVar16 == 0)) goto LAB_00108c03;
                pyVar20 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pyVar20 + 1;
                *pyVar20 = yVar10;
                emitter->column = emitter->column + 1;
                bVar7 = true;
                bVar9 = false;
              }
              else {
                if ((int)uVar27 < 0x85) {
                  if (uVar27 == 0x1b) {
                    pyVar20 = (emitter->buffer).pointer + 5;
                    yVar10 = 'e';
                  }
                  else if (uVar27 == 0x22) {
                    pyVar20 = (emitter->buffer).pointer + 5;
                    yVar10 = '\"';
                  }
                  else {
                    if (uVar27 != 0x5c) goto switchD_00108793_caseD_1;
                    pyVar20 = (emitter->buffer).pointer + 5;
                    yVar10 = '\\';
                  }
                  goto LAB_001088c9;
                }
                if (0x2027 < (int)uVar27) {
                  if (uVar27 == 0x2028) {
                    pyVar20 = (emitter->buffer).pointer + 5;
                    yVar10 = 'L';
                  }
                  else {
                    if (uVar27 != 0x2029) goto switchD_00108793_caseD_1;
                    pyVar20 = (emitter->buffer).pointer + 5;
                    yVar10 = 'P';
                  }
                  goto LAB_001088c9;
                }
                if (uVar27 == 0x85) {
                  pyVar20 = (emitter->buffer).pointer + 5;
                  yVar10 = 'N';
                  goto LAB_001088c9;
                }
                if (uVar27 == 0xa0) {
                  pyVar20 = (emitter->buffer).pointer + 5;
                  yVar10 = '_';
                  goto LAB_001088c9;
                }
switchD_00108793_caseD_1:
                if (uVar27 < 0x100) {
                  iVar16 = 4;
                  yVar10 = 'x';
                  if ((emitter->buffer).end <= (emitter->buffer).pointer + 5) {
                    iVar14 = yaml_emitter_flush(emitter);
                    yVar10 = 'x';
                    goto LAB_00108b8e;
                  }
                }
                else {
                  pyVar20 = (emitter->buffer).end;
                  pyVar23 = (emitter->buffer).pointer + 5;
                  if (uVar27 < 0x10000) {
                    iVar16 = 0xc;
                    yVar10 = 'u';
                    if (pyVar20 <= pyVar23) {
                      iVar14 = yaml_emitter_flush(emitter);
                      yVar10 = 'u';
LAB_00108b8e:
                      if (iVar14 == 0) goto LAB_00108c03;
                    }
                  }
                  else {
                    iVar16 = 0x1c;
                    yVar10 = 'U';
                    if (pyVar20 <= pyVar23) {
                      iVar14 = yaml_emitter_flush(emitter);
                      yVar10 = 'U';
                      goto LAB_00108b8e;
                    }
                  }
                }
                pyVar20 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pyVar20 + 1;
                *pyVar20 = yVar10;
                emitter->column = emitter->column + 1;
                do {
                  bVar11 = (byte)iVar16 & 0x1f;
                  if (((emitter->buffer).end <= (emitter->buffer).pointer + 5) &&
                     (iVar14 = yaml_emitter_flush(emitter), iVar14 == 0)) {
                    bVar7 = false;
                    uVar26 = 0 >> bVar11;
                    bVar9 = bVar29;
                    break;
                  }
                  uVar15 = uVar27 >> bVar11 & 0xf;
                  cVar8 = (char)uVar15;
                  yVar10 = cVar8 + '0';
                  if (9 < uVar15) {
                    yVar10 = cVar8 + '7';
                  }
                  pyVar20 = (emitter->buffer).pointer;
                  (emitter->buffer).pointer = pyVar20 + 1;
                  *pyVar20 = yVar10;
                  emitter->column = emitter->column + 1;
                  bVar7 = true;
                  bVar9 = false;
                  uVar26 = 0;
                  bVar6 = 3 < iVar16;
                  iVar16 = iVar16 + -4;
                } while (bVar6);
              }
            }
            else {
LAB_00108c03:
              bVar7 = false;
              bVar9 = bVar29;
            }
            uVar15 = uVar26;
            if (!bVar7) goto LAB_001093d6;
            pbVar22 = pbVar22 + uVar13;
            bVar29 = bVar9;
          }
        } while (pbVar22 != pbVar28 + sVar2);
      }
      pcVar18 = "\"";
      goto LAB_001093e5;
    }
    break;
  case YAML_LITERAL_SCALAR_STYLE:
    pbVar28 = (emitter->scalar_data).value;
    pbVar22 = pbVar28 + (emitter->scalar_data).length;
    bVar29 = false;
    iVar12 = yaml_emitter_write_indicator(emitter,"|",1,0,0);
    uVar15 = uVar27;
    if (((iVar12 != 0) &&
        (string_00.end = pbVar22, string_00.start = pbVar28, string_00.pointer = pbVar28,
        iVar12 = yaml_emitter_write_block_scalar_hints(emitter,string_00), iVar12 != 0)) &&
       (((emitter->buffer).pointer + 5 < (emitter->buffer).end ||
        (iVar12 = yaml_emitter_flush(emitter), iVar12 != 0)))) {
      yVar1 = emitter->line_break;
      if (yVar1 == YAML_CR_BREAK) {
        yVar10 = '\r';
LAB_001099b6:
        pyVar20 = (emitter->buffer).pointer;
        (emitter->buffer).pointer = pyVar20 + 1;
        *pyVar20 = yVar10;
      }
      else {
        if (yVar1 == YAML_CRLN_BREAK) {
          pyVar20 = (emitter->buffer).pointer;
          (emitter->buffer).pointer = pyVar20 + 1;
          *pyVar20 = '\r';
LAB_001099b0:
          yVar10 = '\n';
          goto LAB_001099b6;
        }
        if (yVar1 == YAML_LN_BREAK) goto LAB_001099b0;
      }
      emitter->column = 0;
      emitter->whitespace = 1;
      emitter->line = emitter->line + 1;
      emitter->indention = 1;
      if (pbVar28 != pbVar22) {
        iVar12 = 1;
        do {
          bVar11 = *pbVar28;
          if (bVar11 < 0xc2) {
            if ((bVar11 != 10) && (bVar11 != 0xd)) goto LAB_00109ac2;
LAB_00109a53:
            if (((emitter->buffer).end <= (emitter->buffer).pointer + 5) &&
               (iVar12 = yaml_emitter_flush(emitter), iVar12 == 0)) goto LAB_00109cfb;
            bVar11 = *pbVar28;
            if (bVar11 == 10) {
              if (((emitter->buffer).pointer + 5 < (emitter->buffer).end) ||
                 (iVar12 = yaml_emitter_flush(emitter), iVar12 != 0)) {
                yVar1 = emitter->line_break;
                if (yVar1 == YAML_CR_BREAK) {
                  yVar10 = '\r';
LAB_00109bb9:
                  pyVar20 = (emitter->buffer).pointer;
                  (emitter->buffer).pointer = pyVar20 + 1;
                  *pyVar20 = yVar10;
                }
                else {
                  if (yVar1 == YAML_CRLN_BREAK) {
                    pyVar20 = (emitter->buffer).pointer;
                    (emitter->buffer).pointer = pyVar20 + 1;
                    *pyVar20 = '\r';
LAB_00109bb3:
                    yVar10 = '\n';
                    goto LAB_00109bb9;
                  }
                  if (yVar1 == YAML_LN_BREAK) goto LAB_00109bb3;
                }
                emitter->column = 0;
                emitter->line = emitter->line + 1;
              }
              pbVar28 = pbVar28 + 1;
            }
            else {
              if ((char)bVar11 < '\0') {
                if ((bVar11 & 0xe0) == 0xc0) {
                  pbVar4 = (emitter->buffer).pointer;
                  (emitter->buffer).pointer = pbVar4 + 1;
                  *pbVar4 = bVar11;
                  bVar11 = pbVar28[1];
                  pbVar28 = pbVar28 + 2;
                  goto LAB_00109cc1;
                }
                if ((bVar11 & 0xf0) == 0xe0) {
                  pbVar4 = (emitter->buffer).pointer;
                  (emitter->buffer).pointer = pbVar4 + 1;
                  *pbVar4 = bVar11;
                  bVar11 = pbVar28[1];
                  pbVar4 = (emitter->buffer).pointer;
                  (emitter->buffer).pointer = pbVar4 + 1;
                  *pbVar4 = bVar11;
                  bVar11 = pbVar28[2];
                  pbVar28 = pbVar28 + 3;
                  goto LAB_00109cc1;
                }
                if ((bVar11 & 0xf8) == 0xf0) {
                  pbVar4 = (emitter->buffer).pointer;
                  (emitter->buffer).pointer = pbVar4 + 1;
                  *pbVar4 = bVar11;
                  bVar11 = pbVar28[1];
                  pbVar4 = (emitter->buffer).pointer;
                  (emitter->buffer).pointer = pbVar4 + 1;
                  *pbVar4 = bVar11;
                  bVar11 = pbVar28[2];
                  pbVar4 = (emitter->buffer).pointer;
                  (emitter->buffer).pointer = pbVar4 + 1;
                  *pbVar4 = bVar11;
                  bVar11 = pbVar28[3];
                  pbVar28 = pbVar28 + 4;
                  goto LAB_00109cc1;
                }
              }
              else {
                pbVar28 = pbVar28 + 1;
LAB_00109cc1:
                pbVar4 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar4 + 1;
                *pbVar4 = bVar11;
              }
              emitter->column = 0;
              emitter->line = emitter->line + 1;
            }
            iVar12 = 1;
          }
          else {
            if (((bVar11 != 0xe2) && (bVar11 == 0xc2)) && (pbVar28[1] == 0x85)) goto LAB_00109a53;
LAB_00109ac2:
            if (((iVar12 != 0) && (iVar12 = yaml_emitter_write_indent(emitter), iVar12 == 0)) ||
               (((emitter->buffer).end <= (emitter->buffer).pointer + 5 &&
                (iVar12 = yaml_emitter_flush(emitter), iVar12 == 0)))) goto LAB_00109cfb;
            bVar11 = *pbVar28;
            if ((char)bVar11 < '\0') {
              if ((bVar11 & 0xe0) == 0xc0) {
                pbVar4 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar4 + 1;
                *pbVar4 = bVar11;
                bVar11 = pbVar28[1];
                pbVar28 = pbVar28 + 2;
                goto LAB_00109c62;
              }
              if ((bVar11 & 0xf0) == 0xe0) {
                pbVar4 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar4 + 1;
                *pbVar4 = bVar11;
                bVar11 = pbVar28[1];
                pbVar4 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar4 + 1;
                *pbVar4 = bVar11;
                bVar11 = pbVar28[2];
                pbVar28 = pbVar28 + 3;
                goto LAB_00109c62;
              }
              if ((bVar11 & 0xf8) == 0xf0) {
                pbVar4 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar4 + 1;
                *pbVar4 = bVar11;
                bVar11 = pbVar28[1];
                pbVar4 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar4 + 1;
                *pbVar4 = bVar11;
                bVar11 = pbVar28[2];
                pbVar4 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar4 + 1;
                *pbVar4 = bVar11;
                bVar11 = pbVar28[3];
                pbVar28 = pbVar28 + 4;
                goto LAB_00109c62;
              }
            }
            else {
              pbVar28 = pbVar28 + 1;
LAB_00109c62:
              pbVar4 = (emitter->buffer).pointer;
              (emitter->buffer).pointer = pbVar4 + 1;
              *pbVar4 = bVar11;
            }
            emitter->column = emitter->column + 1;
            iVar12 = 0;
          }
          emitter->indention = iVar12;
        } while (pbVar28 != pbVar22);
      }
LAB_00109cf3:
      bVar29 = true;
      uVar15 = uVar27;
    }
    break;
  case YAML_FOLDED_SCALAR_STYLE:
    pbVar28 = (emitter->scalar_data).value;
    pbVar22 = pbVar28 + (emitter->scalar_data).length;
    iVar12 = yaml_emitter_write_indicator(emitter,">",1,0,0);
    if (((iVar12 != 0) &&
        (string.end = pbVar22, string.start = pbVar28, string.pointer = pbVar28,
        iVar12 = yaml_emitter_write_block_scalar_hints(emitter,string), bVar29 = false, iVar12 != 0)
        ) && (((emitter->buffer).pointer + 5 < (emitter->buffer).end ||
              (iVar12 = yaml_emitter_flush(emitter), uVar15 = uVar27, iVar12 != 0)))) {
      yVar1 = emitter->line_break;
      if (yVar1 == YAML_CR_BREAK) {
        yVar10 = '\r';
LAB_0010942a:
        pyVar20 = (emitter->buffer).pointer;
        (emitter->buffer).pointer = pyVar20 + 1;
        *pyVar20 = yVar10;
      }
      else {
        if (yVar1 == YAML_CRLN_BREAK) {
          pyVar20 = (emitter->buffer).pointer;
          (emitter->buffer).pointer = pyVar20 + 1;
          *pyVar20 = '\r';
LAB_00109424:
          yVar10 = '\n';
          goto LAB_0010942a;
        }
        if (yVar1 == YAML_LN_BREAK) goto LAB_00109424;
      }
      emitter->column = 0;
      emitter->whitespace = 1;
      emitter->line = emitter->line + 1;
      emitter->indention = 1;
      if (pbVar28 != pbVar22) {
        bVar29 = true;
        iVar12 = 1;
        do {
          bVar11 = *pbVar28;
          if (bVar11 < 0xc2) {
            if ((bVar11 != 10) && (bVar11 != 0xd)) goto LAB_00109583;
LAB_001094d7:
            if ((iVar12 == 0) && ((!bVar29 && (bVar11 == 10)))) {
              uVar15 = 0;
              while( true ) {
                bVar11 = pbVar28[uVar15];
                if (((bVar11 != 10) && (bVar11 != 0xd)) &&
                   ((uVar26 = (uint)bVar11, uVar26 != 0xc2 || (pbVar28[(ulong)uVar15 + 1] != 0x85)))
                   ) break;
                iVar12 = 1;
                if ((((char)bVar11 < '\0') && (iVar12 = 2, (bVar11 & 0xe0) != 0xc0)) &&
                   (iVar12 = 3, (bVar11 & 0xf0) != 0xe0)) {
                  iVar12 = (uint)((bVar11 & 0xf8) == 0xf0) << 2;
                }
                uVar15 = uVar15 + iVar12;
              }
              if (((0x20 < uVar26) || ((0x100002600U >> ((ulong)uVar26 & 0x3f) & 1) == 0)) &&
                 (((bVar11 != 0xc2 || (pbVar28[(ulong)uVar15 + 1] != 0x85)) && (bVar11 != 0)))) {
                if (((emitter->buffer).end <= (emitter->buffer).pointer + 5) &&
                   (iVar12 = yaml_emitter_flush(emitter), iVar12 == 0)) goto LAB_00109cfb;
                yVar1 = emitter->line_break;
                if (yVar1 == YAML_CR_BREAK) {
                  yVar10 = '\r';
LAB_0010997e:
                  pyVar20 = (emitter->buffer).pointer;
                  (emitter->buffer).pointer = pyVar20 + 1;
                  *pyVar20 = yVar10;
                }
                else {
                  if (yVar1 == YAML_CRLN_BREAK) {
                    pyVar20 = (emitter->buffer).pointer;
                    (emitter->buffer).pointer = pyVar20 + 1;
                    *pyVar20 = '\r';
LAB_00109978:
                    yVar10 = '\n';
                    goto LAB_0010997e;
                  }
                  if (yVar1 == YAML_LN_BREAK) goto LAB_00109978;
                }
                emitter->column = 0;
                emitter->line = emitter->line + 1;
              }
            }
            if (((emitter->buffer).end <= (emitter->buffer).pointer + 5) &&
               (iVar12 = yaml_emitter_flush(emitter), iVar12 == 0)) goto LAB_00109cfb;
            bVar11 = *pbVar28;
            if (bVar11 == 10) {
              if (((emitter->buffer).pointer + 5 < (emitter->buffer).end) ||
                 (iVar12 = yaml_emitter_flush(emitter), iVar12 != 0)) {
                yVar1 = emitter->line_break;
                if (yVar1 == YAML_CR_BREAK) {
                  yVar10 = '\r';
LAB_001097db:
                  pyVar20 = (emitter->buffer).pointer;
                  (emitter->buffer).pointer = pyVar20 + 1;
                  *pyVar20 = yVar10;
                }
                else {
                  if (yVar1 == YAML_CRLN_BREAK) {
                    pyVar20 = (emitter->buffer).pointer;
                    (emitter->buffer).pointer = pyVar20 + 1;
                    *pyVar20 = '\r';
LAB_001097d5:
                    yVar10 = '\n';
                    goto LAB_001097db;
                  }
                  if (yVar1 == YAML_LN_BREAK) goto LAB_001097d5;
                }
                emitter->column = 0;
                emitter->line = emitter->line + 1;
              }
              pbVar28 = pbVar28 + 1;
            }
            else {
              if ((char)bVar11 < '\0') {
                if ((bVar11 & 0xe0) == 0xc0) {
                  pbVar4 = (emitter->buffer).pointer;
                  (emitter->buffer).pointer = pbVar4 + 1;
                  *pbVar4 = bVar11;
                  bVar11 = pbVar28[1];
                  pbVar28 = pbVar28 + 2;
                  goto LAB_00109930;
                }
                if ((bVar11 & 0xf0) == 0xe0) {
                  pbVar4 = (emitter->buffer).pointer;
                  (emitter->buffer).pointer = pbVar4 + 1;
                  *pbVar4 = bVar11;
                  bVar11 = pbVar28[1];
                  pbVar4 = (emitter->buffer).pointer;
                  (emitter->buffer).pointer = pbVar4 + 1;
                  *pbVar4 = bVar11;
                  bVar11 = pbVar28[2];
                  pbVar28 = pbVar28 + 3;
                  goto LAB_00109930;
                }
                if ((bVar11 & 0xf8) == 0xf0) {
                  pbVar4 = (emitter->buffer).pointer;
                  (emitter->buffer).pointer = pbVar4 + 1;
                  *pbVar4 = bVar11;
                  bVar11 = pbVar28[1];
                  pbVar4 = (emitter->buffer).pointer;
                  (emitter->buffer).pointer = pbVar4 + 1;
                  *pbVar4 = bVar11;
                  bVar11 = pbVar28[2];
                  pbVar4 = (emitter->buffer).pointer;
                  (emitter->buffer).pointer = pbVar4 + 1;
                  *pbVar4 = bVar11;
                  bVar11 = pbVar28[3];
                  pbVar28 = pbVar28 + 4;
                  goto LAB_00109930;
                }
              }
              else {
                pbVar28 = pbVar28 + 1;
LAB_00109930:
                pbVar4 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar4 + 1;
                *pbVar4 = bVar11;
              }
              emitter->column = 0;
              emitter->line = emitter->line + 1;
            }
            iVar12 = 1;
          }
          else {
            if (((bVar11 != 0xe2) && (bVar11 == 0xc2)) && (pbVar28[1] == 0x85)) goto LAB_001094d7;
LAB_00109583:
            if (iVar12 != 0) {
              iVar16 = yaml_emitter_write_indent(emitter);
              if (iVar16 == 0) goto LAB_00109cfb;
              bVar29 = *pbVar28 == 9 || *pbVar28 == 0x20;
            }
            if ((((iVar12 == 0) && (*pbVar28 == 0x20)) && (pbVar28[1] != 0x20)) &&
               (emitter->best_width < emitter->column)) {
              iVar12 = yaml_emitter_write_indent(emitter);
              if (iVar12 == 0) goto LAB_00109cfb;
              bVar11 = *pbVar28;
              lVar24 = 1;
              if ((((char)bVar11 < '\0') && (lVar24 = 2, (bVar11 & 0xe0) != 0xc0)) &&
                 (lVar24 = 3, (bVar11 & 0xf0) != 0xe0)) {
                lVar24 = (ulong)((bVar11 & 0xf8) == 0xf0) << 2;
              }
              pbVar28 = pbVar28 + lVar24;
            }
            else {
              if (((emitter->buffer).end <= (emitter->buffer).pointer + 5) &&
                 (iVar12 = yaml_emitter_flush(emitter), iVar12 == 0)) goto LAB_00109cfb;
              bVar11 = *pbVar28;
              if ((char)bVar11 < '\0') {
                if ((bVar11 & 0xe0) == 0xc0) {
                  pbVar4 = (emitter->buffer).pointer;
                  (emitter->buffer).pointer = pbVar4 + 1;
                  *pbVar4 = bVar11;
                  bVar11 = pbVar28[1];
                  pbVar28 = pbVar28 + 2;
                  goto LAB_001098d0;
                }
                if ((bVar11 & 0xf0) == 0xe0) {
                  pbVar4 = (emitter->buffer).pointer;
                  (emitter->buffer).pointer = pbVar4 + 1;
                  *pbVar4 = bVar11;
                  bVar11 = pbVar28[1];
                  pbVar4 = (emitter->buffer).pointer;
                  (emitter->buffer).pointer = pbVar4 + 1;
                  *pbVar4 = bVar11;
                  bVar11 = pbVar28[2];
                  pbVar28 = pbVar28 + 3;
                  goto LAB_001098d0;
                }
                if ((bVar11 & 0xf8) == 0xf0) {
                  pbVar4 = (emitter->buffer).pointer;
                  (emitter->buffer).pointer = pbVar4 + 1;
                  *pbVar4 = bVar11;
                  bVar11 = pbVar28[1];
                  pbVar4 = (emitter->buffer).pointer;
                  (emitter->buffer).pointer = pbVar4 + 1;
                  *pbVar4 = bVar11;
                  bVar11 = pbVar28[2];
                  pbVar4 = (emitter->buffer).pointer;
                  (emitter->buffer).pointer = pbVar4 + 1;
                  *pbVar4 = bVar11;
                  bVar11 = pbVar28[3];
                  pbVar28 = pbVar28 + 4;
                  goto LAB_001098d0;
                }
              }
              else {
                pbVar28 = pbVar28 + 1;
LAB_001098d0:
                pbVar4 = (emitter->buffer).pointer;
                (emitter->buffer).pointer = pbVar4 + 1;
                *pbVar4 = bVar11;
              }
              emitter->column = emitter->column + 1;
            }
            iVar12 = 0;
          }
          emitter->indention = iVar12;
        } while (pbVar28 != pbVar22);
      }
      goto LAB_00109cf3;
    }
  }
switchD_00107dbe_default:
  if (!bVar29) {
    return uVar15;
  }
  pyVar17 = (emitter->states).top;
  piVar5 = (emitter->indents).top;
  (emitter->indents).top = piVar5 + -1;
  emitter->indent = piVar5[-1];
LAB_00107b90:
  (emitter->states).top = pyVar17 + -1;
  emitter->state = pyVar17[-1];
  return 1;
LAB_00109cfb:
  bVar29 = false;
  uVar15 = uVar27;
  goto switchD_00107dbe_default;
}

Assistant:

static int
yaml_emitter_emit_node(yaml_emitter_t *emitter, yaml_event_t *event,
        int root, int sequence, int mapping, int simple_key)
{
    emitter->root_context = root;
    emitter->sequence_context = sequence;
    emitter->mapping_context = mapping;
    emitter->simple_key_context = simple_key;

    switch (event->type)
    {
        case YAML_ALIAS_EVENT:
            return yaml_emitter_emit_alias(emitter, event);

        case YAML_SCALAR_EVENT:
            return yaml_emitter_emit_scalar(emitter, event);

        case YAML_SEQUENCE_START_EVENT:
            return yaml_emitter_emit_sequence_start(emitter, event);

        case YAML_MAPPING_START_EVENT:
            return yaml_emitter_emit_mapping_start(emitter, event);

        default:
            return yaml_emitter_set_emitter_error(emitter,
                    "expected SCALAR, SEQUENCE-START, MAPPING-START, or ALIAS");
    }

    return 0;
}